

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

Int __thiscall ipx::Basis::Load(Basis *this,int *basic_status)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  int iVar1;
  reference pvVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  long in_RSI;
  long in_RDI;
  Basis *in_stack_00000030;
  Int j;
  Int p;
  vector<int,_std::allocator<int>_> map2basis;
  vector<int,_std::allocator<int>_> basis;
  Int n;
  Int m;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef8;
  value_type_conflict2 *in_stack_ffffffffffffff08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff28;
  value_type in_stack_ffffffffffffff2c;
  int local_6c;
  int local_68;
  vector<int,_std::allocator<int>_> local_50;
  int local_38 [6];
  Int local_20;
  Int local_1c;
  long local_18;
  Int local_4;
  
  local_18 = in_RSI;
  local_1c = Model::rows(*(Model **)(in_RDI + 8));
  local_20 = Model::cols(*(Model **)(in_RDI + 8));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x80afd8);
  std::allocator<int>::allocator((allocator<int> *)0x80b001);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20._M_current,
             in_stack_ffffffffffffff18,(allocator_type *)in_stack_ffffffffffffff10._M_current);
  std::allocator<int>::~allocator((allocator<int> *)0x80b027);
  local_68 = 0;
  for (local_6c = 0; local_6c < local_20 + local_1c; local_6c = local_6c + 1) {
    switch(*(undefined4 *)(local_18 + (long)local_6c * 4)) {
    case 0:
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10._M_current,
                 in_stack_ffffffffffffff08);
      iVar1 = local_68 + 1;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_6c);
      *pvVar2 = local_68;
      in_stack_ffffffffffffff2c = local_68;
      local_68 = iVar1;
      break;
    case 1:
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10._M_current,
                 in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff28 = local_68 + local_1c;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_6c);
      *pvVar2 = in_stack_ffffffffffffff28;
      local_68 = local_68 + 1;
      break;
    case 0xfffffffe:
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_6c);
      *pvVar2 = -2;
      break;
    case 0xffffffff:
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,(long)local_6c);
      *pvVar2 = -1;
      break;
    default:
      local_4 = 0x6b;
      goto LAB_0080b311;
    }
  }
  if (local_68 == local_1c) {
    __result._M_current = local_38;
    std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffef8);
    std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffef8);
    std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffef8);
    _Var3._M_current._4_4_ = in_stack_ffffffffffffff2c;
    _Var3._M_current._0_4_ = in_stack_ffffffffffffff28;
    _Var3 = std::
            copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (_Var3,in_stack_ffffffffffffff20,__result);
    std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffef8);
    std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffef8);
    std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffef8);
    __first._M_current._4_4_ = in_stack_ffffffffffffff2c;
    __first._M_current._0_4_ = in_stack_ffffffffffffff28;
    in_stack_ffffffffffffff10 =
         std::
         copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                   (__first,_Var3,__result);
    local_4 = Factorize(in_stack_00000030);
  }
  else {
    local_4 = 0x6b;
  }
LAB_0080b311:
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10._M_current);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff10._M_current);
  return local_4;
}

Assistant:

Int Basis::Load(const int* basic_status) {
    const Int m = model_.rows();
    const Int n = model_.cols();

    // Change member variables only when basis is valid.
    std::vector<Int> basis, map2basis(n+m);
    Int p = 0;
    for (Int j = 0; j < n+m; j++) {
        switch (basic_status[j]) {
        case NONBASIC_FIXED:
            map2basis[j] = -2;
            break;
        case NONBASIC:
            map2basis[j] = -1;
            break;
        case BASIC:
            basis.push_back(j);
            map2basis[j] = p++;
            break;
        case BASIC_FREE:
            basis.push_back(j);
            map2basis[j] = p++ + m;
            break;
        default:
            return IPX_ERROR_invalid_basis;
        }
    }
    if (p != m)
        return IPX_ERROR_invalid_basis;

    std::copy(basis.begin(), basis.end(), basis_.begin());
    std::copy(map2basis.begin(), map2basis.end(), map2basis_.begin());
    return Factorize();
}